

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

string * __thiscall
punky::ast::FunctionLiteral::to_string_abi_cxx11_
          (string *__return_storage_ptr__,FunctionLiteral *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  BlockStmt *pBVar3;
  _Storage<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false>
  _Var4;
  long *plVar5;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  ulong *puVar10;
  undefined8 uVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  string param_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  undefined8 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a0;
  string local_98;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  ulong *local_58;
  long local_50;
  ulong local_48 [2];
  FunctionLiteral *local_38;
  
  ExprNode::token_literal_abi_cxx11_(&local_98,&this->super_ExprNode);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  psVar9 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar9) {
    lVar6 = plVar7[3];
    paVar1->_M_allocated_capacity = *psVar9;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar7;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar9;
  }
  __return_storage_ptr__->_M_string_length = plVar7[1];
  *plVar7 = (long)psVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  paVar2 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pBVar3 = (this->m_body)._M_t.
           super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
           ._M_t.
           super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
           .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl;
  if (pBVar3 == (BlockStmt *)0x0) {
    return __return_storage_ptr__;
  }
  if ((this->m_params).
      super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
      ._M_payload.
      super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
      ._M_engaged != true) {
    (**(code **)(*(long *)&(pBVar3->super_StmtNode).super_AstNode + 0x18))(&local_c0);
    puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x11966a);
    puVar10 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar10) {
      local_98.field_2._M_allocated_capacity = *puVar10;
      local_98.field_2._8_8_ = puVar8[3];
      local_98._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar10;
      local_98._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_98._M_string_length = puVar8[1];
    *puVar8 = puVar10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    uVar11 = local_b0._M_allocated_capacity;
    _Var13._M_p = (pointer)local_c0;
    if (local_c0 == &local_b0) {
      return __return_storage_ptr__;
    }
    goto LAB_0010b708;
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  _Var4 = (this->m_params).
          super__Optional_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::unique_ptr<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>,_std::default_delete<std::vector<punky::ast::Identifier,_std::allocator<punky::ast::Identifier>_>_>_>_>
          ._M_payload;
  plVar7 = *(long **)_Var4;
  plVar5 = *(long **)((long)_Var4 + 8);
  local_a0 = paVar1;
  if (plVar7 != plVar5) {
    local_38 = this;
    do {
      (**(code **)(*plVar7 + 0x18))(&local_78,plVar7);
      puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_78);
      puVar10 = puVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_b0._M_allocated_capacity = *puVar10;
        local_b0._8_8_ = puVar8[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0._M_allocated_capacity = *puVar10;
        local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar8;
      }
      local_b8 = puVar8[1];
      *puVar8 = puVar10;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_c0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      this = local_38;
      plVar7 = plVar7 + 7;
    } while (plVar7 != plVar5);
    if (2 < local_98._M_string_length) {
      std::__cxx11::string::pop_back();
      std::__cxx11::string::pop_back();
    }
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,local_98._M_dataplus._M_p,
             local_98._M_dataplus._M_p + local_98._M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  (**(code **)(*(long *)&(((this->m_body)._M_t.
                           super___uniq_ptr_impl<punky::ast::BlockStmt,_std::default_delete<punky::ast::BlockStmt>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_punky::ast::BlockStmt_*,_std::default_delete<punky::ast::BlockStmt>_>
                           .super__Head_base<0UL,_punky::ast::BlockStmt_*,_false>._M_head_impl)->
                         super_StmtNode).super_AstNode + 0x18))(&local_58);
  uVar12 = 0xf;
  if (local_78 != local_68) {
    uVar12 = local_68[0];
  }
  if (uVar12 < (ulong)(local_50 + local_70)) {
    uVar12 = 0xf;
    if (local_58 != local_48) {
      uVar12 = local_48[0];
    }
    if (uVar12 < (ulong)(local_50 + local_70)) goto LAB_0010b5d7;
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_78);
  }
  else {
LAB_0010b5d7:
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_58);
  }
  local_c0 = &local_b0;
  puVar10 = puVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar10) {
    local_b0._M_allocated_capacity = *puVar10;
    local_b0._8_8_ = puVar8[3];
  }
  else {
    local_b0._M_allocated_capacity = *puVar10;
    local_c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar8;
  }
  local_b8 = puVar8[1];
  *puVar8 = puVar10;
  puVar8[1] = 0;
  *(undefined1 *)puVar10 = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_c0);
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  uVar11 = local_98.field_2._M_allocated_capacity;
  _Var13._M_p = local_98._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    return __return_storage_ptr__;
  }
LAB_0010b708:
  operator_delete(_Var13._M_p,uVar11 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string FunctionLiteral::to_string() const
{
    std::string fn_str{token_literal() + "("};
    if (m_body)
    {
        if (m_params.has_value())
        {
            std::string param_str;
            for (const auto& param : *m_params.value())
                param_str.append(param.to_string() + ", ");
            if (param_str.size() > 2)
            {
                param_str.pop_back();
                param_str.pop_back();
            }
            fn_str.append(param_str + ") " + m_body->to_string());
        }
        else
            fn_str.append(") " + m_body->to_string());
    }
    return fn_str;
}